

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalNinjaGenerator::WriteCustomCommandBuildStatement
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          *targets,string *fileConfig)

{
  cmGlobalNinjaGenerator *this_00;
  pointer pbVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *this_01;
  cmake *this_02;
  long lVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  mapped_type *pmVar9;
  _Rb_tree_header *p_Var10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  _Rb_tree_node_base *p_Var12;
  iterator iVar13;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  __it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  cmSourceFile *this_03;
  ulong uVar14;
  string *psVar15;
  undefined4 extraout_var;
  cmListFileBacktrace *backtrace;
  string *psVar16;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  size_t extraout_RDX;
  size_t __n;
  byte bVar17;
  pointer this_04;
  byte bVar18;
  pointer pbVar19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view input;
  pair<std::_Rb_tree_iterator<const_cmCustomCommand_*>,_bool> pVar20;
  string customStep;
  string depfile;
  cmNinjaDeps sortedOrderOnlyDeps;
  cmNinjaDeps ninjaDeps;
  string mainOutput;
  CCOutputs ccOutputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> ccgs;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jDeps;
  pointer local_250;
  pointer pbStack_248;
  pointer local_240;
  pointer local_220;
  pointer pbStack_218;
  pointer local_210;
  pointer local_208;
  pointer pbStack_200;
  pointer local_1f8;
  pointer local_1d8;
  pointer pbStack_1d0;
  pointer local_1c8;
  _Rb_tree_node_base local_1b8;
  size_t local_198;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  string local_170;
  undefined1 *local_150;
  size_t local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  cmCustomCommandGenerator *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_128;
  string local_120;
  string comment;
  cmCryptoHash hash;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  orderOnlyDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  CCOutputs local_68;
  
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  jDeps._M_h._M_buckets = (__buckets_ptr)cc;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&this_00->Configs,fileConfig);
  pVar20 = std::
           _Rb_tree<cmCustomCommand_const*,cmCustomCommand_const*,std::_Identity<cmCustomCommand_const*>,std::less<cmCustomCommand_const*>,std::allocator<cmCustomCommand_const*>>
           ::_M_insert_unique<cmCustomCommand_const*const&>
                     ((_Rb_tree<cmCustomCommand_const*,cmCustomCommand_const*,std::_Identity<cmCustomCommand_const*>,std::less<cmCustomCommand_const*>,std::allocator<cmCustomCommand_const*>>
                       *)&pmVar9->CustomCommands,(cmCustomCommand **)&jDeps);
  if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0xf])(&ccgs,this,cc,fileConfig);
    local_130 = ccgs.
                super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ccgs.super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ccgs.super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var10 = &(targets->_M_t)._M_impl.super__Rb_tree_header;
      this_04 = ccgs.
                super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar11 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_04);
        if (((pvVar11->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (pvVar11->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) ||
           (pvVar11 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_04),
           (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start !=
           (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish)) {
          orderOnlyDeps._M_h._M_buckets = &orderOnlyDeps._M_h._M_single_bucket;
          orderOnlyDeps._M_h._M_bucket_count = 1;
          orderOnlyDeps._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          orderOnlyDeps._M_h._M_element_count = 0;
          orderOnlyDeps._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          orderOnlyDeps._M_h._M_rehash_policy._M_next_resize = 0;
          orderOnlyDeps._M_h._M_single_bucket = (__node_base_ptr)0x0;
          bVar5 = cmCustomCommand::GetDependsExplicitOnly(cc);
          if (!bVar5) {
            p_Var12 = (targets->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var12 == p_Var10) {
              __assert_fail("j != targets.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalNinjaGenerator.cxx"
                            ,0x281,
                            "void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(const cmCustomCommand *, const std::set<cmGeneratorTarget *> &, const std::string &)"
                           );
            }
            cmGlobalNinjaGenerator::AppendTargetDependsClosure
                      ((cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                       *(cmGeneratorTarget **)(p_Var12 + 1),
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&orderOnlyDeps._M_h,&this_04->OutputConfig,fileConfig,
                       1 < (ulong)(((long)ccgs.
                                          super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ccgs.
                                          super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                  0x2e8ba2e8ba2e8ba3),true);
            for (p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                (_Rb_tree_header *)p_Var12 != p_Var10;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
              jDeps._M_h._M_buckets = &jDeps._M_h._M_single_bucket;
              jDeps._M_h._M_bucket_count = 1;
              jDeps._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              jDeps._M_h._M_element_count = 0;
              jDeps._M_h._M_rehash_policy._M_max_load_factor = 1.0;
              jDeps._M_h._M_rehash_policy._M_next_resize = 0;
              jDeps._M_h._M_single_bucket = (__node_base_ptr)0x0;
              cmGlobalNinjaGenerator::AppendTargetDependsClosure
                        ((cmGlobalNinjaGenerator *)
                         (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                         ,*(cmGeneratorTarget **)(p_Var12 + 1),&jDeps,&this_04->OutputConfig,
                         fileConfig,
                         1 < (ulong)(((long)ccgs.
                                            super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ccgs.
                                            super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                    0x2e8ba2e8ba2e8ba3),true);
              __it._M_cur = (__node_type *)orderOnlyDeps._M_h._M_before_begin;
              while (__it._M_cur != (__node_type *)0x0) {
                iVar13 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&jDeps,
                                (key_type *)
                                &(__it._M_cur)->
                                 super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               );
                if (iVar13.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  __it._M_cur = (__node_type *)
                                std::
                                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                ::erase(&orderOnlyDeps._M_h,__it._M_cur);
                }
                else {
                  __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
                }
              }
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)&jDeps);
            }
          }
          pvVar11 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_04);
          paths = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_04);
          pbVar19 = (pvVar11->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (pvVar11->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_128 = pvVar11;
          if (pbVar19 == pbVar1) {
            bVar18 = 1;
          }
          else {
            bVar17 = 0;
            do {
              this_03 = cmMakefile::GetSource
                                  ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                                   Makefile,pbVar19,Ambiguous);
              if (this_03 == (cmSourceFile *)0x0) {
LAB_0036381f:
                bVar6 = false;
                bVar18 = bVar17;
              }
              else {
                jDeps._M_h._M_buckets = &jDeps._M_h._M_before_begin._M_nxt;
                std::__cxx11::string::_M_construct<char_const*>((string *)&jDeps,"SYMBOLIC","");
                bVar5 = cmSourceFile::GetPropertyAsBool(this_03,(string *)&jDeps);
                if ((__node_base *)jDeps._M_h._M_buckets != &jDeps._M_h._M_before_begin) {
                  operator_delete(jDeps._M_h._M_buckets,
                                  (ulong)((long)&(jDeps._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
                }
                bVar6 = true;
                bVar18 = 1;
                if (!bVar5) goto LAB_0036381f;
              }
            } while ((!bVar6) && (pbVar19 = pbVar19 + 1, bVar17 = bVar18, pbVar19 != pbVar1));
            bVar18 = bVar18 ^ 1;
          }
          ccOutputs.WorkDirOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ccOutputs.WorkDirOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ccOutputs.ExplicitOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ccOutputs.WorkDirOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ccOutputs.ExplicitOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ccOutputs.ExplicitOuts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ccOutputs.GG = this_00;
          cmGlobalNinjaGenerator::CCOutputs::Add(&ccOutputs,local_128);
          cmGlobalNinjaGenerator::CCOutputs::Add(&ccOutputs,paths);
          mainOutput._M_dataplus._M_p = (pointer)&mainOutput.field_2;
          pcVar2 = ((ccOutputs.ExplicitOuts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&mainOutput,pcVar2,
                     pcVar2 + (ccOutputs.ExplicitOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          ninjaDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ninjaDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ninjaDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          AppendCustomCommandDeps(this,this_04,&ninjaDeps,fileConfig);
          cmdLines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          cmdLines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cmdLines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          AppendCustomCommandLines(this,this_04,&cmdLines);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &sortedOrderOnlyDeps,
                     (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      )orderOnlyDeps._M_h._M_before_begin._M_nxt,
                     (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      )0x0,(allocator_type *)&jDeps);
          pbVar1 = sortedOrderOnlyDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar19 = sortedOrderOnlyDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sortedOrderOnlyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              sortedOrderOnlyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar14 = (long)sortedOrderOnlyDeps.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)sortedOrderOnlyDeps.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            lVar4 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar4 == 0; lVar4 = lVar4 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (sortedOrderOnlyDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       sortedOrderOnlyDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pbVar19,pbVar1);
          }
          if (cmdLines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              cmdLines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_150 = &local_140;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"phony","");
            jDeps._M_h._M_buckets = &jDeps._M_h._M_before_begin._M_nxt;
            jDeps._M_h._M_bucket_count = 0;
            jDeps._M_h._M_before_begin._M_nxt =
                 jDeps._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
            jDeps._M_h._M_rehash_policy._0_8_ = &jDeps._M_h._M_single_bucket;
            if (local_150 != &local_140) {
              jDeps._M_h._M_rehash_policy._0_8_ = local_150;
            }
            jDeps._M_h._M_single_bucket = (__node_base_ptr)CONCAT71(uStack_13f,local_140);
            jDeps._M_h._M_rehash_policy._M_next_resize = local_148;
            local_148 = 0;
            local_140 = 0;
            local_1b8._M_color = _S_red;
            local_1b8._M_parent = (_Base_ptr)0x0;
            local_150 = &local_140;
            memset(&local_250,0,0x90);
            local_1b8._M_left = &local_1b8;
            local_198 = 0;
            local_190._M_p = (pointer)&local_180;
            local_188 = 0;
            local_180._M_local_buf[0] = '\0';
            customStep._M_dataplus._M_p = &DAT_00000019;
            customStep._M_string_length = (size_type)anon_var_dwarf_114e6a8;
            customStep.field_2._M_allocated_capacity = 0;
            customStep.field_2._8_8_ = mainOutput._M_string_length;
            views._M_len = 2;
            views._M_array = (iterator)&customStep;
            local_1b8._M_right = local_1b8._M_left;
            cmCatViews(&depfile,views);
            std::__cxx11::string::operator=((string *)&jDeps,(string *)&depfile);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)depfile._M_dataplus._M_p != &depfile.field_2) {
              operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
            }
            customStep.field_2._M_allocated_capacity = (size_type)local_240;
            customStep._M_string_length = (size_type)pbStack_248;
            customStep._M_dataplus._M_p = (pointer)local_250;
            local_250 = ccOutputs.ExplicitOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pbStack_248 = ccOutputs.ExplicitOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_240 = ccOutputs.ExplicitOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&customStep);
            customStep.field_2._M_allocated_capacity = (size_type)local_210;
            customStep._M_string_length = (size_type)pbStack_218;
            customStep._M_dataplus._M_p = (pointer)local_220;
            local_220 = ccOutputs.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pbStack_218 = ccOutputs.WorkDirOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_210 = ccOutputs.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&customStep);
            customStep.field_2._M_allocated_capacity = (size_type)local_1f8;
            customStep._M_string_length = (size_type)pbStack_200;
            customStep._M_dataplus._M_p = (pointer)local_208;
            local_208 = ninjaDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pbStack_200 = ninjaDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_1f8 = ninjaDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&customStep);
            customStep.field_2._M_allocated_capacity = (size_type)local_1c8;
            customStep._M_string_length = (size_type)pbStack_1d0;
            customStep._M_dataplus._M_p = (pointer)local_1d8;
            local_1d8 = sortedOrderOnlyDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pbStack_1d0 = sortedOrderOnlyDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_1c8 = sortedOrderOnlyDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&customStep);
            pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            iVar7 = (*pcVar3->_vptr_cmGlobalGenerator[0x45])(pcVar3,fileConfig);
            cmGlobalNinjaGenerator::WriteBuild
                      (this_00,(ostream *)CONCAT44(extraout_var,iVar7),(cmNinjaBuild *)&jDeps,0,
                       (bool *)0x0);
            cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&jDeps);
          }
          else {
            cmsys::SystemTools::GetFilenameName(&customStep,&mainOutput);
            iVar7 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)
                      ->_vptr_cmGlobalGenerator[0x28])();
            if ((char)iVar7 != '\0') {
              std::__cxx11::string::push_back((char)&customStep);
              std::__cxx11::string::_M_append
                        ((char *)&customStep,(ulong)(fileConfig->_M_dataplus)._M_p);
              std::__cxx11::string::push_back((char)&customStep);
              std::__cxx11::string::_M_append
                        ((char *)&customStep,(ulong)(this_04->OutputConfig)._M_dataplus._M_p);
            }
            std::__cxx11::string::push_back((char)&customStep);
            cmCryptoHash::cmCryptoHash(&hash,AlgoSHA256);
            input._M_str = mainOutput._M_dataplus._M_p;
            input._M_len = mainOutput._M_string_length;
            cmCryptoHash::HashString_abi_cxx11_(&depfile,&hash,input);
            std::__cxx11::string::substr((ulong)&jDeps,(ulong)&depfile);
            std::__cxx11::string::_M_append((char *)&customStep,(ulong)jDeps._M_h._M_buckets);
            if ((__node_base *)jDeps._M_h._M_buckets != &jDeps._M_h._M_before_begin) {
              operator_delete(jDeps._M_h._M_buckets,
                              (ulong)((long)&(jDeps._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)depfile._M_dataplus._M_p != &depfile.field_2) {
              operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
            }
            cmCustomCommandGenerator::GetDepfile_abi_cxx11_(&depfile,this_04);
            if (depfile._M_string_length != 0) {
              PVar8 = cmCustomCommand::GetCMP0116Status(cc);
              if (PVar8 - NEW < 3) {
                cmCustomCommandGenerator::GetInternalDepfile_abi_cxx11_((string *)&jDeps,this_04);
                std::__cxx11::string::operator=((string *)&depfile,(string *)&jDeps);
LAB_00363afe:
                if ((__node_base *)jDeps._M_h._M_buckets != &jDeps._M_h._M_before_begin) {
                  operator_delete(jDeps._M_h._M_buckets,
                                  (ulong)((long)&(jDeps._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
                }
              }
              else if (PVar8 == WARN) {
                psVar16 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                    ((cmLocalGenerator *)this);
                psVar15 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
                __n = psVar16->_M_string_length;
                bVar6 = true;
                bVar5 = true;
                if (__n == psVar15->_M_string_length) {
                  if (__n == 0) {
                    bVar5 = false;
                  }
                  else {
                    iVar7 = bcmp((psVar16->_M_dataplus)._M_p,(psVar15->_M_dataplus)._M_p,__n);
                    bVar5 = iVar7 != 0;
                    __n = extraout_RDX;
                  }
                }
                id = (PolicyID)__n;
                if (!bVar5) {
                  this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_170,"CMAKE_POLICY_WARNING_CMP0116","");
                  bVar6 = cmMakefile::PolicyOptionalWarningEnabled(this_01,&local_170);
                  id = extraout_EDX;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    local_170.field_2._M_allocated_capacity + 1);
                    id = extraout_EDX_00;
                  }
                }
                if (bVar6 != false) {
                  this_02 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator)->CMakeInstance;
                  cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&jDeps,(cmPolicies *)0x74,id);
                  backtrace = cmCustomCommand::GetBacktrace(cc);
                  cmake::IssueMessage(this_02,AUTHOR_WARNING,(string *)&jDeps,backtrace);
                  goto LAB_00363afe;
                }
              }
            }
            jDeps._M_h._M_buckets = (__buckets_ptr)0x13;
            jDeps._M_h._M_bucket_count = (size_type)anon_var_dwarf_114e6c0;
            jDeps._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            jDeps._M_h._M_element_count = mainOutput._M_string_length;
            jDeps._M_h._M_rehash_policy._0_8_ = mainOutput._M_dataplus._M_p;
            jDeps._M_h._M_rehash_policy._M_next_resize = 0;
            views_00._M_len = 2;
            views_00._M_array = (iterator)&jDeps;
            cmCatViews(&comment,views_00);
            BuildCommandLine((string *)&jDeps,this,&cmdLines,&this_04->OutputConfig,fileConfig,
                             &customStep,(cmGeneratorTarget *)0x0);
            cmLocalGenerator::ConstructComment_abi_cxx11_
                      (&local_120,(cmLocalGenerator *)this,this_04,"");
            psVar16 = cmCustomCommand::GetJobPool_abi_cxx11_(cc);
            bVar5 = cmCustomCommand::GetUsesTerminal(cc);
            local_68.GG = ccOutputs.GG;
            local_68.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 ccOutputs.ExplicitOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_68.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 ccOutputs.ExplicitOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_68.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 ccOutputs.ExplicitOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ccOutputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_68.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 ccOutputs.WorkDirOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_68.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 ccOutputs.WorkDirOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_68.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 ccOutputs.WorkDirOuts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ccOutputs.WorkDirOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_80.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 ninjaDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_80.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 ninjaDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_80.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 ninjaDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ninjaDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 sortedOrderOnlyDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 sortedOrderOnlyDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 sortedOrderOnlyDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            sortedOrderOnlyDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmGlobalNinjaGenerator::WriteCustomCommandBuild
                      (this_00,(string *)&jDeps,&local_120,&comment,&depfile,psVar16,bVar5,
                       (bool)(bVar18 | (paths->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start !=
                                       (paths->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish),fileConfig,
                       &local_68,&local_80,&local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_68.WorkDirOuts);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_68.ExplicitOuts);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((__node_base *)jDeps._M_h._M_buckets != &jDeps._M_h._M_before_begin) {
              operator_delete(jDeps._M_h._M_buckets,
                              (ulong)((long)&(jDeps._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)comment._M_dataplus._M_p != &comment.field_2) {
              operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)depfile._M_dataplus._M_p != &depfile.field_2) {
              operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
            }
            cmCryptoHash::~cmCryptoHash(&hash);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)customStep._M_dataplus._M_p != &customStep.field_2) {
              operator_delete(customStep._M_dataplus._M_p,
                              customStep.field_2._M_allocated_capacity + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&sortedOrderOnlyDeps);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&cmdLines);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&ninjaDeps);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mainOutput._M_dataplus._M_p != &mainOutput.field_2) {
            operator_delete(mainOutput._M_dataplus._M_p,mainOutput.field_2._M_allocated_capacity + 1
                           );
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&ccOutputs.WorkDirOuts);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&ccOutputs.ExplicitOuts);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&orderOnlyDeps._M_h);
        }
        this_04 = this_04 + 1;
      } while (this_04 != local_130);
    }
    std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::~vector(&ccgs)
    ;
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(
  cmCustomCommand const* cc, const std::set<cmGeneratorTarget*>& targets,
  const std::string& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
  if (gg->SeenCustomCommand(cc, fileConfig)) {
    return;
  }

  auto ccgs = this->MakeCustomCommandGenerators(*cc, fileConfig);
  for (cmCustomCommandGenerator const& ccg : ccgs) {
    if (ccg.GetOutputs().empty() && ccg.GetByproducts().empty()) {
      // Generator expressions evaluate to no output for this config.
      continue;
    }

    std::unordered_set<std::string> orderOnlyDeps;

    if (!cc->GetDependsExplicitOnly()) {
      // A custom command may appear on multiple targets.  However, some build
      // systems exist where the target dependencies on some of the targets are
      // overspecified, leading to a dependency cycle.  If we assume all target
      // dependencies are a superset of the true target dependencies for this
      // custom command, we can take the set intersection of all target
      // dependencies to obtain a correct dependency list.
      //
      // FIXME: This won't work in certain obscure scenarios involving indirect
      // dependencies.
      auto j = targets.begin();
      assert(j != targets.end());
      this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
        *j, orderOnlyDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
      ++j;

      for (; j != targets.end(); ++j) {
        std::unordered_set<std::string> jDeps;
        this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
          *j, jDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
        cm::erase_if(orderOnlyDeps, [&jDeps](std::string const& dep) {
          return jDeps.find(dep) == jDeps.end();
        });
      }
    }

    const std::vector<std::string>& outputs = ccg.GetOutputs();
    const std::vector<std::string>& byproducts = ccg.GetByproducts();

    bool symbolic = false;
    for (std::string const& output : outputs) {
      if (cmSourceFile* sf = this->Makefile->GetSource(output)) {
        if (sf->GetPropertyAsBool("SYMBOLIC")) {
          symbolic = true;
          break;
        }
      }
    }

    cmGlobalNinjaGenerator::CCOutputs ccOutputs(gg);
    ccOutputs.Add(outputs);
    ccOutputs.Add(byproducts);

    std::string mainOutput = ccOutputs.ExplicitOuts[0];

    cmNinjaDeps ninjaDeps;
    this->AppendCustomCommandDeps(ccg, ninjaDeps, fileConfig);

    std::vector<std::string> cmdLines;
    this->AppendCustomCommandLines(ccg, cmdLines);

    cmNinjaDeps sortedOrderOnlyDeps(orderOnlyDeps.begin(),
                                    orderOnlyDeps.end());
    std::sort(sortedOrderOnlyDeps.begin(), sortedOrderOnlyDeps.end());

    if (cmdLines.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = cmStrCat("Phony custom command for ", mainOutput);
      build.Outputs = std::move(ccOutputs.ExplicitOuts);
      build.WorkDirOuts = std::move(ccOutputs.WorkDirOuts);
      build.ExplicitDeps = std::move(ninjaDeps);
      build.OrderOnlyDeps = std::move(sortedOrderOnlyDeps);
      gg->WriteBuild(this->GetImplFileStream(fileConfig), build);
    } else {
      std::string customStep = cmSystemTools::GetFilenameName(mainOutput);
      if (this->GlobalGenerator->IsMultiConfig()) {
        customStep += '-';
        customStep += fileConfig;
        customStep += '-';
        customStep += ccg.GetOutputConfig();
      }
      // Hash full path to make unique.
      customStep += '-';
      cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
      customStep += hash.HashString(mainOutput).substr(0, 7);

      std::string depfile = ccg.GetDepfile();
      if (!depfile.empty()) {
        switch (cc->GetCMP0116Status()) {
          case cmPolicies::WARN:
            if (this->GetCurrentBinaryDirectory() !=
                  this->GetBinaryDirectory() ||
                this->Makefile->PolicyOptionalWarningEnabled(
                  "CMAKE_POLICY_WARNING_CMP0116")) {
              this->GetCMakeInstance()->IssueMessage(
                MessageType::AUTHOR_WARNING,
                cmPolicies::GetPolicyWarning(cmPolicies::CMP0116),
                cc->GetBacktrace());
            }
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            depfile = ccg.GetInternalDepfile();
            break;
        }
      }

      std::string comment = cmStrCat("Custom command for ", mainOutput);
      gg->WriteCustomCommandBuild(
        this->BuildCommandLine(cmdLines, ccg.GetOutputConfig(), fileConfig,
                               customStep),
        this->ConstructComment(ccg), comment, depfile, cc->GetJobPool(),
        cc->GetUsesTerminal(),
        /*restat*/ !symbolic || !byproducts.empty(), fileConfig,
        std::move(ccOutputs), std::move(ninjaDeps),
        std::move(sortedOrderOnlyDeps));
    }
  }
}